

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerReflection::emit_type_array(CompilerReflection *this,SPIRType *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Stream *pSVar2;
  size_t sVar3;
  uint *puVar4;
  bool *pbVar5;
  bool bVar6;
  long lVar7;
  size_t sVar8;
  string local_50;
  
  bVar6 = Compiler::is_physical_pointer((Compiler *)this,type);
  if ((!bVar6) && ((type->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
    pSVar2 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"array","");
    simple_json::Stream::emit_json_key_array(pSVar2,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    sVar3 = (type->array).super_VectorView<unsigned_int>.buffer_size;
    if (sVar3 != 0) {
      puVar4 = (type->array).super_VectorView<unsigned_int>.ptr;
      lVar7 = 0;
      do {
        simple_json::Stream::emit_json_array_value
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   *(uint32_t *)((long)puVar4 + lVar7));
        lVar7 = lVar7 + 4;
      } while (sVar3 << 2 != lVar7);
    }
    simple_json::Stream::end_json_array
              ((this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pSVar2 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"array_size_is_literal","");
    simple_json::Stream::emit_json_key_array(pSVar2,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    sVar3 = (type->array_size_literal).super_VectorView<bool>.buffer_size;
    if (sVar3 != 0) {
      pbVar5 = (type->array_size_literal).super_VectorView<bool>.ptr;
      sVar8 = 0;
      do {
        simple_json::Stream::emit_json_array_value
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   pbVar5[sVar8]);
        sVar8 = sVar8 + 1;
      } while (sVar3 != sVar8);
    }
    simple_json::Stream::end_json_array
              ((this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void CompilerReflection::emit_type_array(const SPIRType &type)
{
	if (!is_physical_pointer(type) && !type.array.empty())
	{
		json_stream->emit_json_key_array("array");
		// Note that we emit the zeros here as a means of identifying
		// unbounded arrays.  This is necessary as otherwise there would
		// be no way of differentiating between float[4] and float[4][]
		for (const auto &value : type.array)
			json_stream->emit_json_array_value(value);
		json_stream->end_json_array();

		json_stream->emit_json_key_array("array_size_is_literal");
		for (const auto &value : type.array_size_literal)
			json_stream->emit_json_array_value(value);
		json_stream->end_json_array();
	}
}